

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>_>,_bool>
 __thiscall
itlib::
flat_map<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>>>
::
insert<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>
          (flat_map<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>>>
           *this,pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
                 *val)

{
  int iVar1;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>_>
  __position;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>_>,_bool>
  pVar3;
  
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>*,std::vector<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>>>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_comp_val<itlib::fmimpl::pair_compare<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,itlib::fmimpl::less>>>
                         (*(undefined8 *)this,*(undefined8 *)(this + 8),val);
  if (__position._M_current !=
      *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
        **)(this + 8)) {
    iVar1 = std::__cxx11::string::compare((string *)val);
    if (-1 < iVar1) {
      uVar2 = 0;
      goto LAB_0020045f;
    }
  }
  __position._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>
          ::_M_insert_rval((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>
                            *)this,__position._M_current,val);
  uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_0020045f:
  pVar3._8_8_ = uVar2;
  pVar3.first._M_current = __position._M_current;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> insert(P&& val)
    {
        auto i = lower_bound(val.first);
        if (i != end() && !cmp()(val.first, *i))
        {
            return { i, false };
        }

        return{ m_container.emplace(i, std::forward<P>(val)), true };
    }